

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O0

void __thiscall KV::KeyValues::setKeyValue(KeyValues *this,string *kvValue)

{
  KeyValues *pKVar1;
  bool bVar2;
  reference ppVar3;
  pointer pKVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>
  *kv;
  iterator __end2;
  iterator __begin2;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>,_KV::KeyValues::kvCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
  *__range2;
  string *kvValue_local;
  KeyValues *this_local;
  
  bVar2 = isSection(this);
  if (bVar2) {
    __end2 = std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>,_KV::KeyValues::kvCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
             ::begin(&this->keyvalues);
    kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>
          *)std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>,_KV::KeyValues::kvCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
            ::end(&this->keyvalues);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&kv), bVar2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
               ::operator*(&__end2);
      pKVar1 = this->parentKV;
      pKVar4 = std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>::operator->
                         (&ppVar3->second);
      pKVar4->parentKV = pKVar1;
      pKVar4 = std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>::operator->
                         (&ppVar3->second);
      pKVar4->depth = pKVar4->depth - 1;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)&this->value,kvValue);
  return;
}

Assistant:

void KeyValues::setKeyValue( const std::string &kvValue )
	{
		if ( isSection() )
		{
			for ( auto &kv : keyvalues )
			{
				kv.second->parentKV = parentKV;
				--kv.second->depth;
			}
		}

		value = kvValue;
	}